

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slacking.hpp
# Opt level: O2

void __thiscall slack::_detail::Slacking::checkResponse(Slacking *this,string *method,Json *json)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  ostream *poVar4;
  allocator local_49;
  string_t reason;
  
  sVar2 = nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::count<char_const(&)[3]>
                    ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      *)json,(char (*) [3])"ok");
  if (sVar2 != 0) {
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)json,"ok");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::dump(&reason,pvVar3,-1,' ',false,strict);
    bVar1 = std::operator==(&reason,"true");
    std::__cxx11::string::~string((string *)&reason);
    if (bVar1) {
      poVar4 = std::operator<<((ostream *)&std::cout,"<< ");
      poVar4 = std::operator<<(poVar4,(string *)method);
      std::operator<<(poVar4," [passed]\n");
    }
    else {
      sVar2 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::count<char_const(&)[6]>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          *)json,(char (*) [6])0x131333);
      if (sVar2 == 0) {
        std::__cxx11::string::string((string *)&reason,"checkResponse() unknown error.",&local_49);
        trigger_error(this,&reason);
      }
      else {
        pvVar3 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)json,"error");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::dump(&reason,pvVar3,-1,' ',false,strict);
        trigger_error(this,&reason);
        poVar4 = std::operator<<((ostream *)&std::cerr,"<< checkResponse() error details: ");
        poVar4 = nlohmann::operator<<(poVar4,json);
        std::endl<char,std::char_traits<char>>(poVar4);
      }
      std::__cxx11::string::~string((string *)&reason);
    }
  }
  return;
}

Assistant:

void checkResponse(const std::string& method, const Json& json) {
        ignore_unused_parameter(method);
        if (json.count("ok")) {
            if(json["ok"].dump() == "true") {
#if SLACKING_VERBOSE_OUTPUT
                std::cout << "<< " << method << " [passed]\n";
#endif
            }
            else {
                if (json.count("error")) {
                    auto reason = json["error"].dump();
                    trigger_error(reason);
#if SLACKING_VERBOSE_OUTPUT
                    std::cerr << "<< checkResponse() error details: " << json << std::endl;
#endif
                }
                else {
                    trigger_error("checkResponse() unknown error.");
                }
            }
        }
    }